

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  char *pcVar1;
  GLboolean GVar2;
  int iVar3;
  int local_d8;
  int local_d4;
  int height_1;
  int width_1;
  _GLFWwindow *previous;
  _GLFWwindow *window;
  _GLFWwndconfig wndconfig;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  GLFWwindow *share_local;
  GLFWmonitor *monitor_local;
  char *title_local;
  int height_local;
  int width_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    _height_local = (_GLFWwindow *)0x0;
  }
  else if ((width < 1) || (height < 1)) {
    _glfwInputError(0x10004,"Invalid window size");
    _height_local = (_GLFWwindow *)0x0;
  }
  else {
    memcpy(&ctxconfig.share,&_glfw,0x48);
    memcpy(&wndconfig.monitor,&_glfw.hints.context,0x28);
    wndconfig.title = (char *)_glfw.hints.window._16_8_;
    window = (_GLFWwindow *)CONCAT44(height,width);
    if (monitor != (GLFWmonitor *)0x0) {
      wndconfig.title = (char *)CONCAT62(_glfw.hints.window._18_6_,0x101);
      pcVar1 = wndconfig.title;
      wndconfig.title._4_4_ = _glfw.hints.window._20_4_;
      wndconfig.title._0_4_ = CONCAT13(1,(int3)pcVar1);
    }
    wndconfig._0_8_ = title;
    wndconfig._16_8_ = monitor;
    ctxconfig._24_8_ = share;
    GVar2 = _glfwIsValidContextConfig((_GLFWctxconfig *)&wndconfig.monitor);
    if (GVar2 == '\0') {
      _height_local = (_GLFWwindow *)0x0;
    }
    else {
      previous = (_GLFWwindow *)calloc(1,0x2e0);
      previous->next = _glfw.windowListHead;
      _glfw.windowListHead = previous;
      (previous->videoMode).width = width;
      (previous->videoMode).height = height;
      (previous->videoMode).redBits = (int)ctxconfig.share;
      (previous->videoMode).greenBits = ctxconfig.share._4_4_;
      (previous->videoMode).blueBits = fbconfig.redBits;
      (previous->videoMode).refreshRate = _glfw.hints.refreshRate;
      previous->monitor = (_GLFWmonitor *)wndconfig._16_8_;
      previous->resizable = (GLboolean)wndconfig.title;
      previous->decorated = wndconfig.title._2_1_;
      previous->autoIconify = wndconfig.title._4_1_;
      previous->floating = wndconfig.title._5_1_;
      previous->cursorMode = 0x34001;
      _height_1 = _glfwPlatformGetCurrentContext();
      iVar3 = _glfwPlatformCreateWindow
                        (previous,(_GLFWwndconfig *)&window,(_GLFWctxconfig *)&wndconfig.monitor,
                         (_GLFWfbconfig *)&ctxconfig.share);
      if (iVar3 == 0) {
        glfwDestroyWindow((GLFWwindow *)previous);
        _glfwPlatformMakeContextCurrent(_height_1);
        _height_local = (_GLFWwindow *)0x0;
      }
      else {
        _glfwPlatformMakeContextCurrent(previous);
        GVar2 = _glfwRefreshContextAttribs((_GLFWctxconfig *)&wndconfig.monitor);
        if (GVar2 == '\0') {
          glfwDestroyWindow((GLFWwindow *)previous);
          _glfwPlatformMakeContextCurrent(_height_1);
          _height_local = (_GLFWwindow *)0x0;
        }
        else {
          GVar2 = _glfwIsValidContext((_GLFWctxconfig *)&wndconfig.monitor);
          if (GVar2 == '\0') {
            glfwDestroyWindow((GLFWwindow *)previous);
            _glfwPlatformMakeContextCurrent(_height_1);
            _height_local = (_GLFWwindow *)0x0;
          }
          else {
            (*previous->Clear)(0x4000);
            _glfwPlatformSwapBuffers(previous);
            _glfwPlatformMakeContextCurrent(_height_1);
            if (wndconfig._16_8_ == 0) {
              if (wndconfig.title._1_1_ != '\0') {
                if (wndconfig.title._3_1_ == '\0') {
                  _glfwPlatformUnhideWindow(previous);
                }
                else {
                  _glfwPlatformShowWindow(previous);
                }
              }
            }
            else {
              _glfwPlatformGetWindowSize(previous,&local_d4,&local_d8);
              previous->cursorPosX = (double)(local_d4 / 2);
              previous->cursorPosY = (double)(local_d8 / 2);
              _glfwPlatformSetCursorPos(previous,previous->cursorPosX,previous->cursorPosY);
            }
            _height_local = previous;
          }
        }
      }
    }
  }
  return (GLFWwindow *)_height_local;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid window size");
        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    wndconfig.monitor = (_GLFWmonitor*) monitor;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (wndconfig.monitor)
    {
        wndconfig.resizable = GL_TRUE;
        wndconfig.visible   = GL_TRUE;
        wndconfig.focused   = GL_TRUE;
    }

    // Check the OpenGL bits of the window config
    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = wndconfig.monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    _glfwPlatformMakeContextCurrent(window);

    // Retrieve the actual (as opposed to requested) context attributes
    if (!_glfwRefreshContextAttribs(&ctxconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    // Verify the context against the requested parameters
    if (!_glfwIsValidContext(&ctxconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    // Clearing the front buffer to black to avoid garbage pixels left over
    // from previous uses of our bit of VRAM
    window->Clear(GL_COLOR_BUFFER_BIT);
    _glfwPlatformSwapBuffers(window);

    // Restore the previously current context (or NULL)
    _glfwPlatformMakeContextCurrent(previous);

    if (wndconfig.monitor)
    {
        int width, height;
        _glfwPlatformGetWindowSize(window, &width, &height);

        window->cursorPosX = width / 2;
        window->cursorPosY = height / 2;

        _glfwPlatformSetCursorPos(window, window->cursorPosX, window->cursorPosY);
    }
    else
    {
        if (wndconfig.visible)
        {
            if (wndconfig.focused)
                _glfwPlatformShowWindow(window);
            else
                _glfwPlatformUnhideWindow(window);
        }
    }

    return (GLFWwindow*) window;
}